

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

void nn_sipc_term(nn_sipc *self)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_SIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
            ,0x5c);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x3c8));
  nn_msg_term((nn_msg *)0x16a88b);
  nn_msg_term((nn_msg *)0x16a89b);
  nn_pipebase_term((nn_pipebase *)0x16a8ab);
  nn_streamhdr_term((nn_streamhdr *)0x16a8b8);
  nn_fsm_term((nn_fsm *)0x16a8c1);
  return;
}

Assistant:

void nn_sipc_term (struct nn_sipc *self)
{
    nn_assert_state (self, NN_SIPC_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_term (&self->inmsg);
    nn_pipebase_term (&self->pipebase);
    nn_streamhdr_term (&self->streamhdr);
    nn_fsm_term (&self->fsm);
}